

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O0

void Imath_3_2::extractEulerZYX<float>(Matrix44<float> *mat,Vec3<float> *rot)

{
  float e;
  float f;
  float g;
  float i_00;
  float *pfVar1;
  float *in_RSI;
  Matrix44<float> *in_RDI;
  double dVar2;
  float cy;
  Matrix44<float> N;
  Matrix44<float> M;
  Vec3<float> k;
  Vec3<float> j;
  Vec3<float> i;
  undefined4 in_stack_fffffffffffffe70;
  float j_00;
  undefined4 in_stack_fffffffffffffe74;
  float k_00;
  undefined4 in_stack_fffffffffffffe7c;
  float fVar3;
  undefined4 in_stack_fffffffffffffeec;
  float fVar4;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  float fVar5;
  Matrix44<float> local_100;
  Vec3<float> local_c0;
  Matrix44<float> local_b4;
  Matrix44<float> local_74;
  Vec3<float> local_34;
  Vec3<float> local_28;
  Vec3<float> local_1c;
  float *local_10;
  Matrix44<float> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  pfVar1 = Matrix44<float>::operator[](in_RDI,0);
  fVar3 = *pfVar1;
  pfVar1 = Matrix44<float>::operator[](local_8,0);
  fVar5 = pfVar1[1];
  pfVar1 = Matrix44<float>::operator[](local_8,0);
  Vec3<float>::Vec3(&local_1c,fVar3,fVar5,pfVar1[2]);
  pfVar1 = Matrix44<float>::operator[](local_8,1);
  fVar3 = *pfVar1;
  pfVar1 = Matrix44<float>::operator[](local_8,1);
  fVar5 = pfVar1[1];
  pfVar1 = Matrix44<float>::operator[](local_8,1);
  Vec3<float>::Vec3(&local_28,fVar3,fVar5,pfVar1[2]);
  pfVar1 = Matrix44<float>::operator[](local_8,2);
  fVar3 = *pfVar1;
  pfVar1 = Matrix44<float>::operator[](local_8,2);
  fVar5 = pfVar1[1];
  pfVar1 = Matrix44<float>::operator[](local_8,2);
  Vec3<float>::Vec3(&local_34,fVar3,fVar5,pfVar1[2]);
  Vec3<float>::normalize
            ((Vec3<float> *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  Vec3<float>::normalize
            ((Vec3<float> *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  Vec3<float>::normalize
            ((Vec3<float> *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  pfVar1 = Vec3<float>::operator[](&local_1c,0);
  fVar3 = *pfVar1;
  pfVar1 = Vec3<float>::operator[](&local_1c,1);
  fVar5 = *pfVar1;
  pfVar1 = Vec3<float>::operator[](&local_1c,2);
  fVar4 = *pfVar1;
  pfVar1 = Vec3<float>::operator[](&local_28,0);
  e = *pfVar1;
  pfVar1 = Vec3<float>::operator[](&local_28,1);
  f = *pfVar1;
  pfVar1 = Vec3<float>::operator[](&local_28,2);
  g = *pfVar1;
  pfVar1 = Vec3<float>::operator[](&local_34,0);
  i_00 = *pfVar1;
  pfVar1 = Vec3<float>::operator[](&local_34,1);
  j_00 = *pfVar1;
  pfVar1 = Vec3<float>::operator[](&local_34,2);
  k_00 = *pfVar1;
  Matrix44<float>::Matrix44
            (&local_74,fVar3,fVar5,fVar4,0.0,e,f,g,0.0,i_00,j_00,k_00,0.0,0.0,0.0,0.0,1.0);
  pfVar1 = Matrix44<float>::operator[](&local_74,1);
  fVar3 = *pfVar1;
  pfVar1 = Matrix44<float>::operator[](&local_74,0);
  dVar2 = std::atan2((double)(ulong)(uint)fVar3,(double)(ulong)(uint)*pfVar1);
  *local_10 = -SUB84(dVar2,0);
  Matrix44<float>::Matrix44(&local_b4);
  Vec3<float>::Vec3(&local_c0,0.0,0.0,-*local_10);
  Matrix44<float>::rotate<float>
            ((Matrix44<float> *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             (Vec3<float> *)CONCAT44(in_stack_fffffffffffffeec,fVar3));
  Matrix44<float>::operator*
            ((Matrix44<float> *)CONCAT44(in_stack_fffffffffffffe7c,k_00),
             (Matrix44<float> *)CONCAT44(in_stack_fffffffffffffe74,j_00));
  Matrix44<float>::operator=(&local_b4,&local_100);
  pfVar1 = Matrix44<float>::operator[](&local_b4,2);
  fVar3 = pfVar1[2];
  pfVar1 = Matrix44<float>::operator[](&local_b4,2);
  fVar5 = pfVar1[2];
  pfVar1 = Matrix44<float>::operator[](&local_b4,2);
  fVar4 = pfVar1[1];
  pfVar1 = Matrix44<float>::operator[](&local_b4,2);
  dVar2 = std::sqrt((double)(ulong)(uint)(fVar3 * fVar5 + fVar4 * pfVar1[1]));
  pfVar1 = Matrix44<float>::operator[](&local_b4,2);
  dVar2 = std::atan2((double)(ulong)(uint)-*pfVar1,(double)((ulong)dVar2 & 0xffffffff));
  local_10[1] = -SUB84(dVar2,0);
  pfVar1 = Matrix44<float>::operator[](&local_b4,1);
  fVar3 = pfVar1[2];
  pfVar1 = Matrix44<float>::operator[](&local_b4,1);
  dVar2 = std::atan2((double)(ulong)(uint)-fVar3,(double)(ulong)(uint)pfVar1[1]);
  local_10[2] = -SUB84(dVar2,0);
  return;
}

Assistant:

void
extractEulerZYX (const Matrix44<T>& mat, Vec3<T>& rot)
{
    //
    // Normalize the local x, y and z axes to remove scaling.
    //

    Vec3<T> i (mat[0][0], mat[0][1], mat[0][2]);
    Vec3<T> j (mat[1][0], mat[1][1], mat[1][2]);
    Vec3<T> k (mat[2][0], mat[2][1], mat[2][2]);

    i.normalize ();
    j.normalize ();
    k.normalize ();

    Matrix44<T> M (
        i[0],
        i[1],
        i[2],
        0,
        j[0],
        j[1],
        j[2],
        0,
        k[0],
        k[1],
        k[2],
        0,
        0,
        0,
        0,
        1);

    //
    // Extract the first angle, rot.x.
    //

    rot.x = -std::atan2 (M[1][0], M[0][0]);

    //
    // Remove the x rotation from M, so that the remaining
    // rotation, N, is only around two axes, and gimbal lock
    // cannot occur.
    //

    Matrix44<T> N;
    N.rotate (Vec3<T> (0, 0, -rot.x));
    N = N * M;

    //
    // Extract the other two angles, rot.y and rot.z, from N.
    //

    T cy  = std::sqrt (N[2][2] * N[2][2] + N[2][1] * N[2][1]);
    rot.y = -std::atan2 (-N[2][0], cy);
    rot.z = -std::atan2 (-N[1][2], N[1][1]);
}